

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMElementImpl.cpp
# Opt level: O1

DOMElement * __thiscall xercesc_4_0::DOMElementImpl::getNextElementSibling(DOMElementImpl *this)

{
  int iVar1;
  DOMElementImpl *n;
  DOMElement *pDVar2;
  DOMElementImpl *this_00;
  
  n = (DOMElementImpl *)getNextLogicalSibling(this,(DOMNode *)this);
  do {
    if (n == (DOMElementImpl *)0x0) {
      return (DOMElement *)0x0;
    }
    this_00 = n;
    iVar1 = (*(n->super_DOMElement).super_DOMNode._vptr_DOMNode[4])();
    if (iVar1 == 5) {
      pDVar2 = getFirstElementChild(this_00,(DOMNode *)n);
      if (pDVar2 != (DOMElement *)0x0) {
        return pDVar2;
      }
    }
    else if (iVar1 == 1) {
      return &n->super_DOMElement;
    }
    n = (DOMElementImpl *)getNextLogicalSibling(this_00,(DOMNode *)n);
  } while( true );
}

Assistant:

DOMElement * DOMElementImpl::getNextElementSibling() const
{
    DOMNode* n = getNextLogicalSibling(this);
    while (n != NULL) {
        switch (n->getNodeType()) {
            case DOMNode::ELEMENT_NODE:
                return (DOMElement*) n;
            case DOMNode::ENTITY_REFERENCE_NODE:
                {
                    DOMElement* e = getFirstElementChild(n);
                    if (e != NULL)
                        return e;
                }
                break;
            default:
                break;
        }
        n = getNextLogicalSibling(n);
    }
    return NULL;
}